

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_PLYReader_::read_ascii
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt)

{
  Options *pOVar1;
  BaseImporter *pBVar2;
  bool bVar3;
  mostream *pmVar4;
  ostream *this_00;
  float *pfVar5;
  int *piVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  float fVar10;
  byte local_141;
  VertexHandle local_124;
  BaseHandle local_120;
  BaseHandle local_11c;
  BaseHandle local_118;
  VectorT<unsigned_char,_4> local_114;
  BaseHandle local_110;
  BaseHandle local_10c;
  BaseHandle local_108;
  BaseHandle local_104;
  uint local_100;
  uint local_fc;
  BaseHandle local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int local_cc;
  uint propertyIndex;
  VertexHandle local_c4;
  undefined1 local_c0 [4];
  VertexHandle vh;
  VHandles vhandles;
  float tmp;
  Vec4i c;
  VectorT<float,_2> local_88;
  Vec2f t;
  string trash;
  undefined1 local_60 [8];
  Vec3f n;
  Vec3f v;
  uint nV;
  uint idx;
  uint l;
  uint k;
  uint j;
  uint i;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  _PLYReader_ *this_local;
  
  _j = _opt;
  _opt_local = (Options *)_bi;
  _bi_local = (BaseImporter *)_in;
  _in_local = (istream *)this;
  bVar3 = can_u_read(this,_in);
  if (bVar3) {
    VectorT<float,_3>::VectorT((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1));
    VectorT<float,_3>::VectorT((VectorT<float,_3> *)local_60);
    std::__cxx11::string::string((string *)&t);
    VectorT<float,_2>::VectorT(&local_88);
    VectorT<int,_4>::VectorT
              ((VectorT<int,_4> *)
               ((long)&vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c0);
    VertexHandle::VertexHandle(&local_c4,-1);
    (**(code **)(*(long *)_opt_local + 0xd8))
              (_opt_local,this->vertexCount_,this->vertexCount_ * 3,this->faceCount_);
    if (this->vertexDimension_ == 3) {
      k = 0;
      while( true ) {
        local_141 = 0;
        if (k < this->vertexCount_) {
          local_141 = std::ios::eof();
          local_141 = local_141 ^ 0xff;
        }
        if ((local_141 & 1) == 0) break;
        local_cc = (**(code **)(*(long *)_opt_local + 0x18))();
        local_c4.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_cc;
        pfVar5 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),0);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),1);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_3>::operator[]
                           ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),2);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_60,0);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_60,1);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_60,2);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_2>::operator[](&local_88,0);
        *pfVar5 = 0.0;
        pfVar5 = VectorT<float,_2>::operator[](&local_88,1);
        *pfVar5 = 0.0;
        piVar6 = VectorT<int,_4>::operator[]
                           ((VectorT<int,_4> *)
                            ((long)&vhandles.
                                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
        *piVar6 = 0;
        piVar6 = VectorT<int,_4>::operator[]
                           ((VectorT<int,_4> *)
                            ((long)&vhandles.
                                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1);
        *piVar6 = 0;
        piVar6 = VectorT<int,_4>::operator[]
                           ((VectorT<int,_4> *)
                            ((long)&vhandles.
                                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),2);
        *piVar6 = 0;
        piVar6 = VectorT<int,_4>::operator[]
                           ((VectorT<int,_4> *)
                            ((long)&vhandles.
                                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),3);
        *piVar6 = 0xff;
        for (local_d0 = 0; local_d0 < this->vertexPropertyCount_; local_d0 = local_d0 + 1) {
          local_d4 = local_d0;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_d4);
          pBVar2 = _bi_local;
          switch(pmVar7->property) {
          case XCOORD:
            pfVar5 = VectorT<float,_3>::operator[]
                               ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),0);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case YCOORD:
            pfVar5 = VectorT<float,_3>::operator[]
                               ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),1);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case ZCOORD:
            pfVar5 = VectorT<float,_3>::operator[]
                               ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),2);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case TEXX:
            pfVar5 = VectorT<float,_2>::operator[](&local_88,0);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case TEXY:
            pfVar5 = VectorT<float,_2>::operator[](&local_88,1);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case COLORRED:
            local_d8 = local_d0;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_d8);
            bVar3 = true;
            if (pmVar7->value != ValueTypeFLOAT32) {
              local_dc = local_d0;
              pmVar7 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](&this->vertexPropertyMap_,(key_type *)&local_dc);
              bVar3 = pmVar7->value == ValueTypeFLOAT;
            }
            pBVar2 = _bi_local;
            if (bVar3) {
              std::istream::operator>>
                        (_bi_local,
                         (float *)&vhandles.
                                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              fVar10 = vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 255.0;
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0)
              ;
              *piVar6 = (int)fVar10;
            }
            else {
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0)
              ;
              std::istream::operator>>(pBVar2,piVar6);
            }
            break;
          case COLORGREEN:
            local_e0 = local_d0;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_e0);
            bVar3 = true;
            if (pmVar7->value != ValueTypeFLOAT32) {
              local_e4 = local_d0;
              pmVar7 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](&this->vertexPropertyMap_,(key_type *)&local_e4);
              bVar3 = pmVar7->value == ValueTypeFLOAT;
            }
            pBVar2 = _bi_local;
            if (bVar3) {
              std::istream::operator>>
                        (_bi_local,
                         (float *)&vhandles.
                                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              fVar10 = vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 255.0;
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1)
              ;
              *piVar6 = (int)fVar10;
            }
            else {
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1)
              ;
              std::istream::operator>>(pBVar2,piVar6);
            }
            break;
          case COLORBLUE:
            local_e8 = local_d0;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_e8);
            bVar3 = true;
            if (pmVar7->value != ValueTypeFLOAT32) {
              local_ec = local_d0;
              pmVar7 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](&this->vertexPropertyMap_,(key_type *)&local_ec);
              bVar3 = pmVar7->value == ValueTypeFLOAT;
            }
            pBVar2 = _bi_local;
            if (bVar3) {
              std::istream::operator>>
                        (_bi_local,
                         (float *)&vhandles.
                                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              fVar10 = vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 255.0;
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),2)
              ;
              *piVar6 = (int)fVar10;
            }
            else {
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),2)
              ;
              std::istream::operator>>(pBVar2,piVar6);
            }
            break;
          case COLORALPHA:
            local_f0 = local_d0;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_f0);
            bVar3 = true;
            if (pmVar7->value != ValueTypeFLOAT32) {
              local_f4 = local_d0;
              pmVar7 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](&this->vertexPropertyMap_,(key_type *)&local_f4);
              bVar3 = pmVar7->value == ValueTypeFLOAT;
            }
            pBVar2 = _bi_local;
            if (bVar3) {
              std::istream::operator>>
                        (_bi_local,
                         (float *)&vhandles.
                                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              fVar10 = vhandles.
                       super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 255.0;
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),3)
              ;
              *piVar6 = (int)fVar10;
            }
            else {
              piVar6 = VectorT<int,_4>::operator[]
                                 ((VectorT<int,_4> *)
                                  ((long)&vhandles.
                                          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),3)
              ;
              std::istream::operator>>(pBVar2,piVar6);
            }
            break;
          case XNORM:
            pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_60,0);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case YNORM:
            pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_60,1);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case ZNORM:
            pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)local_60,2);
            std::istream::operator>>(pBVar2,pfVar5);
            break;
          case CUSTOM_PROP:
            bVar3 = Options::check(_j,0x2000);
            pBVar2 = _bi_local;
            pOVar1 = _opt_local;
            if (bVar3) {
              local_f8 = local_c4.super_BaseHandle.idx_;
              local_fc = local_d0;
              pmVar7 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](&this->vertexPropertyMap_,(key_type *)&local_fc);
              local_100 = local_d0;
              pmVar8 = std::
                       map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                       ::operator[](&this->vertexPropertyMap_,(key_type *)&local_100);
              readCustomProperty(this,(istream *)pBVar2,(BaseImporter *)pOVar1,
                                 (VertexHandle)local_f8.idx_,&pmVar7->name,pmVar8->value);
            }
            else {
              std::operator>>((istream *)_bi_local,(string *)&t);
            }
            break;
          default:
            std::operator>>((istream *)_bi_local,(string *)&t);
          }
        }
        local_104 = local_c4.super_BaseHandle.idx_;
        (**(code **)(*(long *)_opt_local + 0x38))
                  (_opt_local,local_c4.super_BaseHandle.idx_,
                   n.super_VectorDataT<float,_3>.values_ + 1);
        bVar3 = Options::vertex_has_normal(_j);
        if (bVar3) {
          local_108 = local_c4.super_BaseHandle.idx_;
          (**(code **)(*(long *)_opt_local + 0x40))
                    (_opt_local,local_c4.super_BaseHandle.idx_,local_60);
        }
        bVar3 = Options::vertex_has_texcoord(_j);
        if (bVar3) {
          local_10c = local_c4.super_BaseHandle.idx_;
          (**(code **)(*(long *)_opt_local + 0x68))
                    (_opt_local,local_c4.super_BaseHandle.idx_,&local_88);
        }
        bVar3 = Options::vertex_has_color(_j);
        pOVar1 = _opt_local;
        if (bVar3) {
          local_110 = local_c4.super_BaseHandle.idx_;
          VectorT<unsigned_char,_4>::VectorT<int>
                    (&local_114,
                     (VectorT<int,_4> *)
                     ((long)&vhandles.
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          (**(code **)(*(long *)pOVar1 + 0x50))(pOVar1,local_110.idx_,&local_114);
        }
        k = k + 1;
      }
      for (k = 0; k < this->faceCount_; k = k + 1) {
        std::istream::operator>>(_bi_local,(uint *)(v.super_VectorDataT<float,_3>.values_ + 1));
        if (v.super_VectorDataT<float,_3>.values_[1] == 4.2039e-45) {
          std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                    ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     local_c0,3);
          std::istream::operator>>(_bi_local,&l);
          std::istream::operator>>(_bi_local,&idx);
          std::istream::operator>>(_bi_local,&nV);
          VertexHandle::VertexHandle((VertexHandle *)&local_118,l);
          pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                   operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                               *)local_c0,0);
          (pvVar9->super_BaseHandle).idx_ = local_118.idx_;
          VertexHandle::VertexHandle((VertexHandle *)&local_11c,idx);
          pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                   operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                               *)local_c0,1);
          (pvVar9->super_BaseHandle).idx_ = local_11c.idx_;
          VertexHandle::VertexHandle((VertexHandle *)&local_120,nV);
          pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                   operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                               *)local_c0,2);
          (pvVar9->super_BaseHandle).idx_ = local_120.idx_;
        }
        else {
          std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::clear
                    ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     local_c0);
          for (l = 0; l < (uint)v.super_VectorDataT<float,_3>.values_[1]; l = l + 1) {
            std::istream::operator>>(_bi_local,(uint *)(v.super_VectorDataT<float,_3>.values_ + 2));
            VertexHandle::VertexHandle(&local_124,(int)v.super_VectorDataT<float,_3>.values_[2]);
            std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::push_back
                      ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                       local_c0,&local_124);
          }
        }
        (**(code **)(*(long *)_opt_local + 0x20))(_opt_local,local_c0);
      }
      this_local._7_1_ = 1;
    }
    else {
      pmVar4 = omerr();
      this_00 = std::operator<<(&pmVar4->super_ostream,
                                "[PLYReader] : Only vertex dimension 3 is supported.");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    propertyIndex = 1;
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~vector
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_c0);
    std::__cxx11::string::~string((string *)&t);
  }
  else {
    pmVar4 = omerr();
    std::operator<<(&pmVar4->super_ostream,"[PLYReader] : Unable to parse header\n");
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool _PLYReader_::read_ascii(std::istream& _in, BaseImporter& _bi, const Options& _opt) const {

    // Reparse the header
    if (!can_u_read(_in)) {
        omerr() << "[PLYReader] : Unable to parse header\n";
        return false;
    }

    unsigned int i, j, k, l, idx;
    unsigned int nV;
    OpenMesh::Vec3f v, n;
    std::string trash;
    OpenMesh::Vec2f t;
    OpenMesh::Vec4i c;
    float tmp;
    BaseImporter::VHandles vhandles;
    VertexHandle vh;

    _bi.reserve(vertexCount_, 3* vertexCount_ , faceCount_);

    if (vertexDimension_ != 3) {
        omerr() << "[PLYReader] : Only vertex dimension 3 is supported." << std::endl;
        return false;
    }

    // read vertices:
    for (i = 0; i < vertexCount_ && !_in.eof(); ++i) {
        vh = _bi.add_vertex();

        v[0] = 0.0;
        v[1] = 0.0;
        v[2] = 0.0;

        n[0] = 0.0;
        n[1] = 0.0;
        n[2] = 0.0;

        t[0] = 0.0;
        t[1] = 0.0;

        c[0] = 0;
        c[1] = 0;
        c[2] = 0;
        c[3] = 255;

        for (uint propertyIndex = 0; propertyIndex < vertexPropertyCount_; ++propertyIndex) {
            switch (vertexPropertyMap_[propertyIndex].property) {
            case XCOORD:
                _in >> v[0];
                break;
            case YCOORD:
                _in >> v[1];
                break;
            case ZCOORD:
                _in >> v[2];
                break;
            case XNORM:
                _in >> n[0];
                break;
            case YNORM:
                _in >> n[1];
                break;
            case ZNORM:
                _in >> n[2];
                break;
            case TEXX:
                _in >> t[0];
                break;
            case TEXY:
                _in >> t[1];
                break;
            case COLORRED:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[0] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[0];
                break;
            case COLORGREEN:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[1] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[1];
                break;
            case COLORBLUE:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[2] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[2];
                break;
            case COLORALPHA:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    _in >> tmp;
                    c[3] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    _in >> c[3];
                break;
            case CUSTOM_PROP:
                if (_opt.check(Options::Custom))
                  readCustomProperty(_in, _bi, vh, vertexPropertyMap_[propertyIndex].name, vertexPropertyMap_[propertyIndex].value);
                else
                  _in >> trash;
                break;
            default:
                _in >> trash;
                break;
            }
        }

        _bi.set_point(vh, v);
        if (_opt.vertex_has_normal())
          _bi.set_normal(vh, n);
        if (_opt.vertex_has_texcoord())
          _bi.set_texcoord(vh, t);
        if (_opt.vertex_has_color())
          _bi.set_color(vh, Vec4uc(c));
    }

    // faces
    // #N <v1> <v2> .. <v(n-1)> [color spec]
    for (i = 0; i < faceCount_; ++i) {
        // nV = number of Vertices for current face
        _in >> nV;

        if (nV == 3) {
            vhandles.resize(3);
            _in >> j;
            _in >> k;
            _in >> l;

            vhandles[0] = VertexHandle(j);
            vhandles[1] = VertexHandle(k);
            vhandles[2] = VertexHandle(l);
        } else {
            vhandles.clear();
            for (j = 0; j < nV; ++j) {
                _in >> idx;
                vhandles.push_back(VertexHandle(idx));
            }
        }

        _bi.add_face(vhandles);

    }

    // File was successfully parsed.
    return true;
}